

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

bool util::compareString(char *str1,char *str2)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  
  sVar3 = strlen(str1);
  sVar4 = strlen(str2);
  if (sVar3 == sVar4) {
    if (sVar3 == 0) {
      bVar6 = true;
    }
    else {
      lVar5 = 0;
      do {
        iVar1 = tolower((int)str1[lVar5]);
        iVar2 = tolower((int)str2[lVar5]);
        bVar6 = iVar1 == iVar2;
        if (!bVar6) {
          return bVar6;
        }
        bVar7 = sVar3 - 1 != lVar5;
        lVar5 = lVar5 + 1;
      } while (bVar7);
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool util::compareString(const char* str1, const char* str2){
    if(strlen(str1) != strlen(str2))
        return false;
    for(int i = 0; i < strlen(str1); i++)
        if(tolower(str1[i]) != tolower(str2[i]))
            return false;
    return true;
}